

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Translator_X86.cpp
# Opt level: O1

int x86AND(uchar *stream,x86Reg op1,int num)

{
  uchar *puVar1;
  bool bVar2;
  int *piVar3;
  int iVar4;
  
  bVar2 = 8 < (int)op1;
  if (bVar2) {
    *stream = 8 < (int)op1 | 0x40;
  }
  puVar1 = stream + bVar2;
  if (op1 == rEAX) {
    piVar3 = (int *)(stream + (ulong)bVar2 + 1);
    *puVar1 = '%';
    iVar4 = 5;
  }
  else {
    *puVar1 = 0x81;
    piVar3 = (int *)(puVar1 + 2);
    puVar1[1] = regCode[op1] | 0xe0;
    iVar4 = 6;
  }
  *piVar3 = num;
  return ((int)puVar1 + iVar4) - (int)stream;
}

Assistant:

unsigned encodeRex(unsigned char* stream, bool operand64Bit, x86Reg reg, x86Reg index, x86Reg base)
{
	unsigned char code = (operand64Bit ? 0x08 : 0x00) | (reg >= rR8 ? 0x04 : 0x00) | (index >= rR8 ? 0x02 : 0x00) | (base >= rR8 ? 0x01 : 0x00);

	if(code)
	{
		assert(sizeof(void*) == 8);

		*stream = 0x40 | code;
		return 1;
	}

	return 0;
}